

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_data.hpp
# Opt level: O1

string * __thiscall
duckdb::MultiFileColumnDefinition::GetIdentifierName_abi_cxx11_
          (string *__return_storage_ptr__,MultiFileColumnDefinition *this)

{
  pointer pcVar1;
  
  if ((this->identifier).is_null == true) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->name)._M_string_length);
  }
  else {
    Value::GetValue<std::__cxx11::string>(__return_storage_ptr__,&this->identifier);
  }
  return __return_storage_ptr__;
}

Assistant:

string GetIdentifierName() const {
		if (identifier.IsNull()) {
			// No identifier was provided, assume the name as the identifier
			return name;
		}
		D_ASSERT(identifier.type().id() == LogicalTypeId::VARCHAR);
		return identifier.GetValue<string>();
	}